

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

void update_player_regions(level *lev)

{
  int iVar1;
  region **pprVar2;
  region *reg;
  boolean bVar3;
  int x;
  int y;
  long lVar4;
  
  iVar1 = lev->n_regions;
  if (0 < (long)iVar1) {
    pprVar2 = lev->regions;
    x = (int)u.ux;
    y = (int)u.uy;
    lVar4 = 0;
    do {
      reg = pprVar2[lVar4];
      if (reg->attach_2_u == '\0') {
        bVar3 = inside_region(reg,x,y);
        if (bVar3 == '\0') goto LAB_00233603;
        reg->player_flags = reg->player_flags | 1;
      }
      else {
LAB_00233603:
        reg->player_flags = reg->player_flags & 0xfe;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void update_player_regions(struct level *lev)
{
    int i;

    for (i = 0; i < lev->n_regions; i++)
	if (!lev->regions[i]->attach_2_u && inside_region(lev->regions[i], u.ux, u.uy))
	    set_hero_inside(lev->regions[i]);
	else
	    clear_hero_inside(lev->regions[i]);
}